

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg.c
# Opt level: O0

ENGINE * engine_afalg(void)

{
  int iVar1;
  ENGINE *ret;
  ENGINE *in_stack_ffffffffffffffe8;
  ENGINE *local_8;
  
  local_8 = (ENGINE *)ENGINE_new();
  if (local_8 == (ENGINE *)0x0) {
    local_8 = (ENGINE *)0x0;
  }
  else {
    iVar1 = bind_afalg(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      ENGINE_free((ENGINE *)local_8);
      local_8 = (ENGINE *)0x0;
    }
  }
  return local_8;
}

Assistant:

static ENGINE *engine_afalg(void)
{
    ENGINE *ret = ENGINE_new();
    if (ret == NULL)
        return NULL;
    if (!bind_afalg(ret)) {
        ENGINE_free(ret);
        return NULL;
    }
    return ret;
}